

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

bool __thiscall GGWave::prepare(GGWave *this,Parameters *parameters,bool allocate)

{
  int *n;
  RxProtocols *protocols;
  float fVar1;
  byte bVar2;
  ggwave_SampleFormat gVar3;
  ggwave_SampleFormat gVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  void *p;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  float fVar12;
  
  if (this->m_heap != (void *)0x0) {
    free(this->m_heap);
    this->m_heap = (void *)0x0;
    this->m_heapSize = 0;
  }
  fVar1 = parameters->sampleRateOut;
  this->m_sampleRateInp = parameters->sampleRateInp;
  this->m_sampleRateOut = fVar1;
  this->m_sampleRate = parameters->sampleRate;
  iVar7 = parameters->samplesPerFrame;
  this->m_samplesPerFrame = iVar7;
  this->m_isamplesPerFrame = 1.0 / (float)iVar7;
  iVar7 = anon_unknown.dwarf_1e7f::bytesForSampleFormat(parameters->sampleFormatInp);
  this->m_sampleSizeInp = iVar7;
  iVar8 = anon_unknown.dwarf_1e7f::bytesForSampleFormat(parameters->sampleFormatOut);
  this->m_sampleSizeOut = iVar8;
  gVar3 = parameters->sampleFormatInp;
  this->m_sampleFormatInp = gVar3;
  gVar4 = parameters->sampleFormatOut;
  this->m_sampleFormatOut = gVar4;
  fVar1 = this->m_sampleRate;
  fVar12 = fVar1 / (float)this->m_samplesPerFrame;
  this->m_hzPerSample = fVar12;
  this->m_ihzPerSample = 1.0 / fVar12;
  this->m_freqDelta_bin = 1;
  this->m_freqDelta_hz = fVar12 + fVar12;
  this->m_nBitsInMarker = 0x10;
  iVar7 = parameters->payloadLength;
  this->m_nMarkerFrames = (uint)(iVar7 < 1) << 4;
  this->m_encodedDataOffset = (uint)(iVar7 < 1) * 3;
  this->m_soundMarkerThreshold = parameters->soundMarkerThreshold;
  this->m_isFixedPayloadLength = 0 < iVar7;
  this->m_payloadLength = iVar7;
  bVar2 = (byte)parameters->operatingMode;
  this->m_isRxEnabled = (bool)(bVar2 >> 1 & 1);
  this->m_isTxEnabled = (bool)(bVar2 >> 2 & 1);
  fVar12 = this->m_sampleRateInp;
  this->m_needResampling = (bool)(-(this->m_sampleRateOut != fVar1 || fVar12 != fVar1) & 1);
  this->m_txOnlyTones = (bool)(bVar2 >> 3 & 1);
  this->m_isDSSEnabled = (bool)(bVar2 >> 4 & 1);
  if (this->m_sampleSizeInp == 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      pcVar10 = "Invalid or unsupported capture sample format: %d\n";
      gVar4 = gVar3;
LAB_00107572:
      fprintf((anonymous_namespace)::g_fptr,pcVar10,(ulong)gVar4);
      return false;
    }
  }
  else if (iVar8 == 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      pcVar10 = "Invalid or unsupported playback sample format: %d\n";
      goto LAB_00107572;
    }
  }
  else {
    uVar5 = parameters->samplesPerFrame;
    if ((int)uVar5 < 0x401) {
      if (1000.0 <= fVar12) {
        if (fVar12 <= 96000.0) {
          this->m_heap = (void *)0x0;
          n = &this->m_heapSize;
          this->m_heapSize = 0;
          bVar6 = alloc(this,(void *)0x0,n);
          if (!bVar6) {
            if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
              return false;
            }
            fwrite("Error: failed to compute the size of the required memory\n",0x39,1,
                   (anonymous_namespace)::g_fptr);
            return false;
          }
          if (!allocate) {
            return true;
          }
          uVar5 = this->m_heapSize;
          p = calloc((long)(int)uVar5,1);
          this->m_heap = p;
          this->m_heapSize = 0;
          bVar6 = alloc(this,p,n);
          if (!bVar6) {
            if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
              return false;
            }
            gVar4 = *n;
            pcVar10 = "Error: failed to allocate the required memory: %d\n";
            goto LAB_00107572;
          }
          uVar9 = (ulong)(uint)*n;
          if (uVar5 == *n) {
            if (this->m_isRxEnabled == true) {
              (this->m_rx).samplesNeeded = this->m_samplesPerFrame;
              *(this->m_rx).fftWorkI.m_data = 0;
              *(undefined8 *)((long)&(this->m_rx).protocol.name + 6) = 0;
              (this->m_rx).protocol.name = (char *)0x0;
              (this->m_rx).protocolId = GGWAVE_PROTOCOL_COUNT;
              Protocols::rx();
              protocols = &(this->m_rx).protocols;
              memcpy(protocols,&Protocols::rx::protocols,0x160);
              iVar7 = minFreqStart(this,protocols);
              (this->m_rx).minFreqStart = iVar7;
            }
            if (this->m_isTxEnabled == true) {
              Protocols::tx();
              memcpy(&(this->m_tx).protocols,&Protocols::tx::protocols,0x160);
            }
            iVar7 = init(this,(EVP_PKEY_CTX *)0x10cab7);
            return SUB41(iVar7,0);
          }
          if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
            return false;
          }
          pcVar10 = "Error: failed to allocate memory - heapSize0: %d, heapSize: %d\n";
          goto LAB_00107532;
        }
        if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
          return false;
        }
        pcVar10 = "Error: capture sample rate (%g Hz) must be <= %g Hz\n";
        uVar11 = 0x40f7700000000000;
      }
      else {
        if ((anonymous_namespace)::g_fptr == (FILE *)0x0) {
          return false;
        }
        pcVar10 = "Error: capture sample rate (%g Hz) must be >= %g Hz\n";
        uVar11 = 0x408f400000000000;
      }
      fprintf((anonymous_namespace)::g_fptr,pcVar10,(double)fVar12,uVar11);
    }
    else if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      pcVar10 = "Invalid samples per frame: %d, max: %d\n";
      uVar9 = 0x400;
LAB_00107532:
      fprintf((anonymous_namespace)::g_fptr,pcVar10,(ulong)uVar5,uVar9);
      return false;
    }
  }
  return false;
}

Assistant:

bool GGWave::prepare(const Parameters & parameters, bool allocate) {
    if (m_heap) {
        free(m_heap);
        m_heap = nullptr;
        m_heapSize = 0;
    }

    // parameter initialization:

    m_sampleRateInp        = parameters.sampleRateInp;
    m_sampleRateOut        = parameters.sampleRateOut;
    m_sampleRate           = parameters.sampleRate;
    m_samplesPerFrame      = parameters.samplesPerFrame;
    m_isamplesPerFrame     = 1.0f/m_samplesPerFrame;
    m_sampleSizeInp        = bytesForSampleFormat(parameters.sampleFormatInp);
    m_sampleSizeOut        = bytesForSampleFormat(parameters.sampleFormatOut);
    m_sampleFormatInp      = parameters.sampleFormatInp;
    m_sampleFormatOut      = parameters.sampleFormatOut;
    m_hzPerSample          = m_sampleRate/m_samplesPerFrame;
    m_ihzPerSample         = 1.0f/m_hzPerSample;
    m_freqDelta_bin        = 1;
    m_freqDelta_hz         = 2*m_hzPerSample;
    m_nBitsInMarker        = 16;
    m_nMarkerFrames        = parameters.payloadLength > 0 ? 0 : kDefaultMarkerFrames;
    m_encodedDataOffset    = parameters.payloadLength > 0 ? 0 : kDefaultEncodedDataOffset;
    m_soundMarkerThreshold = parameters.soundMarkerThreshold;
    m_isFixedPayloadLength = parameters.payloadLength > 0;
    m_payloadLength        = parameters.payloadLength;
    m_isRxEnabled          = parameters.operatingMode & GGWAVE_OPERATING_MODE_RX;
    m_isTxEnabled          = parameters.operatingMode & GGWAVE_OPERATING_MODE_TX;
    m_needResampling       = m_sampleRateInp != m_sampleRate || m_sampleRateOut != m_sampleRate;
    m_txOnlyTones          = parameters.operatingMode & GGWAVE_OPERATING_MODE_TX_ONLY_TONES;
    m_isDSSEnabled         = parameters.operatingMode & GGWAVE_OPERATING_MODE_USE_DSS;

    if (m_sampleSizeInp == 0) {
        ggprintf("Invalid or unsupported capture sample format: %d\n", (int) parameters.sampleFormatInp);
        return false;
    }

    if (m_sampleSizeOut == 0) {
        ggprintf("Invalid or unsupported playback sample format: %d\n", (int) parameters.sampleFormatOut);
        return false;
    }

    if (parameters.samplesPerFrame > kMaxSamplesPerFrame) {
        ggprintf("Invalid samples per frame: %d, max: %d\n", parameters.samplesPerFrame, kMaxSamplesPerFrame);
        return false;
    }

    if (m_sampleRateInp < kSampleRateMin) {
        ggprintf("Error: capture sample rate (%g Hz) must be >= %g Hz\n", m_sampleRateInp, kSampleRateMin);
        return false;
    }

    if (m_sampleRateInp > kSampleRateMax) {
        ggprintf("Error: capture sample rate (%g Hz) must be <= %g Hz\n", m_sampleRateInp, kSampleRateMax);
        return false;
    }

    // memory allocation:

    m_heap = nullptr;
    m_heapSize = 0;

    if (this->alloc(m_heap, m_heapSize) == false) {
        ggprintf("Error: failed to compute the size of the required memory\n");
        return false;
    }

    if (allocate == false) {
        return true;
    }

    const auto heapSize0 = m_heapSize;

    m_heap = calloc(m_heapSize, 1);

    m_heapSize = 0;
    if (this->alloc(m_heap, m_heapSize) == false) {
        ggprintf("Error: failed to allocate the required memory: %d\n", m_heapSize);
        return false;
    }

    if (heapSize0 != m_heapSize) {
        ggprintf("Error: failed to allocate memory - heapSize0: %d, heapSize: %d\n", heapSize0, m_heapSize);
        return false;
    }

    if (m_isRxEnabled) {
        m_rx.samplesNeeded = m_samplesPerFrame;

        m_rx.fftWorkI[0] = 0;

        m_rx.protocol   = {};
        m_rx.protocolId = GGWAVE_PROTOCOL_COUNT;
        m_rx.protocols  = Protocols::rx();

        m_rx.minFreqStart = minFreqStart(m_rx.protocols);
    }

    if (m_isTxEnabled) {
        m_tx.protocols = Protocols::tx();
    }

    return init("", {}, 0);
}